

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_DeleteMonitoredItems
               (UA_Server *server,UA_Session *session,UA_DeleteMonitoredItemsRequest *request,
               UA_DeleteMonitoredItemsResponse *response)

{
  UA_StatusCode UVar1;
  UA_Subscription *sub_00;
  UA_StatusCode *pUVar2;
  uint local_78;
  uint local_70;
  uint local_6c;
  ulong local_60;
  size_t i;
  UA_Subscription *sub;
  UA_DeleteMonitoredItemsResponse *response_local;
  UA_DeleteMonitoredItemsRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_70 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_6c = 0;
    }
    else {
      local_6c = session->channel->connection->sockfd;
    }
    local_70 = local_6c;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing DeleteMonitoredItemsRequest"
               ,(ulong)local_70,(ulong)local_78,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  if (request->monitoredItemIdsSize == 0) {
    (response->responseHeader).serviceResult = 0x800f0000;
  }
  else {
    sub_00 = UA_Session_getSubscriptionByID(session,request->subscriptionId);
    if (sub_00 == (UA_Subscription *)0x0) {
      (response->responseHeader).serviceResult = 0x80280000;
    }
    else {
      sub_00->currentLifetimeCount = 0;
      pUVar2 = (UA_StatusCode *)malloc(request->monitoredItemIdsSize << 2);
      response->results = pUVar2;
      if (response->results == (UA_StatusCode *)0x0) {
        (response->responseHeader).serviceResult = 0x80030000;
      }
      else {
        response->resultsSize = request->monitoredItemIdsSize;
        for (local_60 = 0; local_60 < request->monitoredItemIdsSize; local_60 = local_60 + 1) {
          UVar1 = UA_Subscription_deleteMonitoredItem
                            (server,sub_00,request->monitoredItemIds[local_60]);
          response->results[local_60] = UVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void Service_DeleteMonitoredItems(UA_Server *server, UA_Session *session,
                                  const UA_DeleteMonitoredItemsRequest *request,
                                  UA_DeleteMonitoredItemsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing DeleteMonitoredItemsRequest");

    if(request->monitoredItemIdsSize == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    /* Get the subscription */
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    /* Reset the subscription lifetime */
    sub->currentLifetimeCount = 0;
    response->results = UA_malloc(sizeof(UA_StatusCode) * request->monitoredItemIdsSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->monitoredItemIdsSize;

    for(size_t i = 0; i < request->monitoredItemIdsSize; ++i)
        response->results[i] = UA_Subscription_deleteMonitoredItem(server, sub, request->monitoredItemIds[i]);
}